

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

string * cmSystemTools::ComputeFileHash(string *__return_storage_ptr__,string *source,Algo algo)

{
  undefined1 local_30 [8];
  cmCryptoHash hash;
  Algo algo_local;
  string *source_local;
  
  hash.CTX._4_4_ = algo;
  cmCryptoHash::cmCryptoHash((cmCryptoHash *)local_30,algo);
  cmCryptoHash::HashFile(__return_storage_ptr__,(cmCryptoHash *)local_30,source);
  cmCryptoHash::~cmCryptoHash((cmCryptoHash *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string cmSystemTools::ComputeFileHash(const std::string& source,
                                           cmCryptoHash::Algo algo)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  cmCryptoHash hash(algo);
  return hash.HashFile(source);
#else
  (void)source;
  cmSystemTools::Message("hashsum not supported in bootstrapping mode",
                         "Error");
  return std::string();
#endif
}